

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v2.cc
# Opt level: O0

ostream * lf::io::operator<<(ostream *stream,GMshFileV2 *mf)

{
  pair<unsigned_int,_unsigned_int> pVar1;
  bool bVar2;
  ostream *poVar3;
  reference pPVar4;
  reference pEVar5;
  reference piVar6;
  reference puVar7;
  reference pPVar8;
  reference ppVar9;
  char *pcVar10;
  uint local_100;
  uint uStack_fc;
  pair<unsigned_int,_unsigned_int> nm;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range3_2;
  PeriodicEntity *pe_1;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>
  *__range2_3;
  const_iterator cStack_b8;
  uint n_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3_1;
  const_iterator cStack_98;
  int p;
  const_iterator __end3;
  const_iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  Element *e;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_> *__range2_2;
  reference local_58;
  pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *n;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *__range2_1;
  PhysicalEntity *pe;
  const_iterator __end2;
  const_iterator __begin2;
  vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
  *__range2;
  GMshFileV2 *mf_local;
  ostream *stream_local;
  
  poVar3 = std::operator<<(stream,"GMSH FILE: Ver. ");
  poVar3 = std::operator<<(poVar3,(string *)mf);
  pcVar10 = "(Text)";
  if ((mf->IsBinary & 1U) != 0) {
    pcVar10 = "(Binary)";
  }
  poVar3 = std::operator<<(poVar3,pcVar10);
  poVar3 = std::operator<<(poVar3,", size of double = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,mf->DoubleSize);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(stream,"=======================================================");
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(stream,"PHYSICAL ENTITIES (Dimension, Number, Name):");
  std::operator<<(poVar3,'\n');
  __end2 = std::
           vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
           ::begin(&mf->PhysicalEntities);
  pe = (PhysicalEntity *)
       std::
       vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
       ::end(&mf->PhysicalEntities);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_lf::io::GMshFileV2::PhysicalEntity_*,_std::vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>_>
                      (&__end2,(__normal_iterator<const_lf::io::GMshFileV2::PhysicalEntity_*,_std::vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>_>
                                *)&pe);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pPVar4 = __gnu_cxx::
             __normal_iterator<const_lf::io::GMshFileV2::PhysicalEntity_*,_std::vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>_>
             ::operator*(&__end2);
    poVar3 = std::operator<<(stream,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pPVar4->Dimension);
    poVar3 = std::operator<<(poVar3,"\t , ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pPVar4->Number);
    poVar3 = std::operator<<(poVar3,"\t , ");
    poVar3 = std::operator<<(poVar3,(string *)&pPVar4->Name);
    std::operator<<(poVar3,'\n');
    __gnu_cxx::
    __normal_iterator<const_lf::io::GMshFileV2::PhysicalEntity_*,_std::vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>_>
    ::operator++(&__end2);
  }
  poVar3 = std::operator<<(stream,"NODES (Number, coords)");
  std::operator<<(poVar3,'\n');
  __end2_1 = std::
             vector<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
             ::begin(&mf->Nodes);
  n = (pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
      std::
      vector<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
      ::end(&mf->Nodes);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_*,_std::vector<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                      (&__end2_1,
                       (__normal_iterator<const_std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_*,_std::vector<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                        *)&n);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_58 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_*,_std::vector<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
               ::operator*(&__end2_1);
    poVar3 = std::operator<<(stream,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_58->first);
    poVar3 = std::operator<<(poVar3,"\t , ");
    __range2_2 = (vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
                  *)Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_58->second
                              );
    poVar3 = Eigen::operator<<(poVar3,(DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       *)&__range2_2);
    std::operator<<(poVar3,'\n');
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_*,_std::vector<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
    ::operator++(&__end2_1);
  }
  poVar3 = std::operator<<(stream,
                           "ELEMENTS (Number, Type, PhysicalEntity Nr, ElementaryEntityNr, Mesh partitions to which it belongs, Node numbers in it)"
                          );
  std::operator<<(poVar3,'\n');
  __end2_2 = std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
             ::begin(&mf->Elements);
  e = (Element *)
      std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>::end
                (&mf->Elements);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_lf::io::GMshFileV2::Element_*,_std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_>
                      (&__end2_2,
                       (__normal_iterator<const_lf::io::GMshFileV2::Element_*,_std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_>
                        *)&e);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pEVar5 = __gnu_cxx::
             __normal_iterator<const_lf::io::GMshFileV2::Element_*,_std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_>
             ::operator*(&__end2_2);
    poVar3 = std::operator<<(stream,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar5->Number);
    poVar3 = std::operator<<(poVar3,"\t ");
    poVar3 = operator<<(poVar3,pEVar5->Type);
    poVar3 = std::operator<<(poVar3,'\t');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar5->PhysicalEntityNr);
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pEVar5->ElementaryEntityNr);
    std::operator<<(poVar3,"\t");
    __end3 = std::vector<int,_std::allocator<int>_>::begin(&pEVar5->MeshPartitions);
    cStack_98 = std::vector<int,_std::allocator<int>_>::end(&pEVar5->MeshPartitions);
    while( true ) {
      bVar2 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                        (&__end3,&stack0xffffffffffffff68);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      piVar6 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end3);
      poVar3 = (ostream *)std::ostream::operator<<(stream,*piVar6);
      std::operator<<(poVar3,", ");
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end3);
    }
    std::operator<<(stream,'\t');
    __end3_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&pEVar5->NodeNumbers)
    ;
    cStack_b8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&pEVar5->NodeNumbers);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        (&__end3_1,&stack0xffffffffffffff48);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      puVar7 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end3_1);
      poVar3 = (ostream *)std::ostream::operator<<(stream,*puVar7);
      std::operator<<(poVar3,", ");
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end3_1);
    }
    std::operator<<(stream,'\n');
    __gnu_cxx::
    __normal_iterator<const_lf::io::GMshFileV2::Element_*,_std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_>
    ::operator++(&__end2_2);
  }
  std::operator<<(stream,'\n');
  poVar3 = std::operator<<(stream,"PERIODIC ENTITIES:");
  std::operator<<(poVar3,'\n');
  __end2_3 = std::
             vector<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>
             ::begin(&mf->Periodic);
  pe_1 = (PeriodicEntity *)
         std::
         vector<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>
         ::end(&mf->Periodic);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_lf::io::GMshFileV2::PeriodicEntity_*,_std::vector<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>_>
                      (&__end2_3,
                       (__normal_iterator<const_lf::io::GMshFileV2::PeriodicEntity_*,_std::vector<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>_>
                        *)&pe_1);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pPVar8 = __gnu_cxx::
             __normal_iterator<const_lf::io::GMshFileV2::PeriodicEntity_*,_std::vector<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>_>
             ::operator*(&__end2_3);
    poVar3 = std::operator<<((ostream *)&std::cout,"  dim=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pPVar8->Dimension);
    poVar3 = std::operator<<(poVar3,", slaveNr=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pPVar8->ElementarySlaveNr);
    poVar3 = std::operator<<(poVar3,", masterNr=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pPVar8->ElementaryMasterNr);
    std::operator<<(poVar3,'\n');
    __end3_2 = std::
               vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ::begin(&pPVar8->NodeMapping);
    nm = (pair<unsigned_int,_unsigned_int>)
         std::
         vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         ::end(&pPVar8->NodeMapping);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                        (&__end3_2,
                         (__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                          *)&nm);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      ppVar9 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::operator*(&__end3_2);
      pVar1 = *ppVar9;
      poVar3 = std::operator<<((ostream *)&std::cout,"    ");
      local_100 = pVar1.first;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_100);
      poVar3 = std::operator<<(poVar3," <-> ");
      uStack_fc = pVar1.second;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uStack_fc);
      std::operator<<(poVar3,'\n');
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
      ::operator++(&__end3_2);
    }
    __gnu_cxx::
    __normal_iterator<const_lf::io::GMshFileV2::PeriodicEntity_*,_std::vector<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>_>
    ::operator++(&__end2_3);
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const GMshFileV2& mf) {
  stream << "GMSH FILE: Ver. " << mf.VersionNumber
         << (mf.IsBinary ? "(Binary)" : "(Text)")
         << ", size of double = " << mf.DoubleSize << '\n';
  stream << "=======================================================" << '\n';
  stream << "PHYSICAL ENTITIES (Dimension, Number, Name):" << '\n';
  for (const auto& pe : mf.PhysicalEntities) {
    stream << "  " << pe.Dimension << "\t , " << pe.Number << "\t , " << pe.Name
           << '\n';
  }
  stream << "NODES (Number, coords)" << '\n';
  for (const auto& n : mf.Nodes) {
    stream << "  " << n.first << "\t , " << n.second.transpose() << '\n';
  }
  stream << "ELEMENTS (Number, Type, PhysicalEntity Nr, ElementaryEntityNr, "
            "Mesh partitions to which it belongs, Node numbers in it)"
         << '\n';
  for (const auto& e : mf.Elements) {
    stream << "  " << e.Number << "\t " << e.Type << '\t' << e.PhysicalEntityNr
           << "\t" << e.ElementaryEntityNr << "\t";
    for (auto p : e.MeshPartitions) {
      stream << p << ", ";
    }
    stream << '\t';
    for (auto n : e.NodeNumbers) {
      stream << n << ", ";
    }
    stream << '\n';
  }
  stream << '\n';
  stream << "PERIODIC ENTITIES:" << '\n';
  for (const auto& pe : mf.Periodic) {
    std::cout << "  dim=" << pe.Dimension
              << ", slaveNr=" << pe.ElementarySlaveNr
              << ", masterNr=" << pe.ElementaryMasterNr << '\n';
    for (auto nm : pe.NodeMapping) {
      std::cout << "    " << nm.first << " <-> " << nm.second << '\n';
    }
  }
  return stream;
}